

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O0

IterateResult __thiscall deqp::egl::Image::ImageTargetGLES2::iterate(ImageTargetGLES2 *this)

{
  EglTestContext *pEVar1;
  TestLog *pTVar2;
  deBool dVar3;
  GLenum GVar4;
  qpTestResult qVar5;
  uint returnValue;
  Library *pLVar6;
  char *message;
  MessageBuilder *pMVar7;
  EGLDisplay pvVar8;
  EGLConfig config;
  GLubyte *__s;
  long lVar9;
  NotSupportedError *pNVar10;
  TestError *pTVar11;
  EGLContext pvVar12;
  void *returnValue_00;
  bool local_2309;
  GLuint local_22fc;
  undefined1 local_22f8 [4];
  deUint32 dstRbo;
  GLuint local_2174;
  undefined1 local_2170 [4];
  deUint32 dstTex;
  MessageBuilder local_1ff0;
  void *local_1e70;
  EGLImageKHR image;
  EGLint attribs [3];
  deUint32 srcTex;
  allocator<char> local_1cd1;
  string local_1cd0 [32];
  GLubyte *local_1cb0;
  char *glExt;
  MessageBuilder local_1ca0;
  deUint32 local_1b20;
  ContextType local_1b1c;
  undefined1 local_1b18 [8];
  Context context;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  TestLog *local_20;
  TestLog *log;
  Library *egl;
  ImageTargetGLES2 *this_local;
  
  egl = (Library *)this;
  log = (TestLog *)
        EglTestContext::getLibrary((this->super_ImageTestCase).super_TestCase.m_eglTestCtx);
  local_20 = tcu::TestContext::getLog
                       ((this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode.
                        m_testCtx);
  while( true ) {
    dVar3 = ::deGetFalse();
    local_42 = 0;
    local_55 = 0;
    local_2309 = false;
    if (dVar3 == 0) {
      pLVar6 = EglTestContext::getLibrary((this->super_ImageTestCase).super_TestCase.m_eglTestCtx);
      pvVar8 = (this->super_ImageTestCase).m_display;
      std::allocator<char>::allocator();
      local_42 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"EGL_KHR_gl_texture_2D_image",&local_41);
      local_55 = 1;
      local_2309 = eglu::hasExtension(pLVar6,pvVar8,&local_40);
    }
    if ((local_55 & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_40);
    }
    if ((local_42 & 1) != 0) {
      std::allocator<char>::~allocator(&local_41);
    }
    if (((local_2309 ^ 0xffU) & 1) != 0) break;
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      tcu::TestContext::setTestResult
                ((this->super_ImageTestCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      pEVar1 = (this->super_ImageTestCase).super_TestCase.m_eglTestCtx;
      pvVar8 = (this->super_ImageTestCase).m_display;
      local_1b20 = (deUint32)glu::ApiType::es(2,0);
      glu::ContextType::ContextType(&local_1b1c,(ApiType)local_1b20,0);
      Image::Context::Context((Context *)local_1b18,pEVar1,pvVar8,local_1b1c,0x40,0x40);
      tcu::TestLog::operator<<(&local_1ca0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar7 = tcu::MessageBuilder::operator<<(&local_1ca0,(char (*) [18])"Using EGL config ");
      pLVar6 = EglTestContext::getLibrary((this->super_ImageTestCase).super_TestCase.m_eglTestCtx);
      pvVar8 = Image::Context::getEglDisplay((Context *)local_1b18);
      config = Image::Context::getConfig((Context *)local_1b18);
      glExt._4_4_ = eglu::getConfigID(pLVar6,pvVar8,config);
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(int *)((long)&glExt + 4));
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_1ca0);
      __s = glu::CallLogWrapper::glGetString
                      (&(this->super_ImageTestCase).super_CallLogWrapper,0x1f03);
      local_1cb0 = __s;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_1cd0,(char *)__s,&local_1cd1);
      lVar9 = std::__cxx11::string::find((char *)local_1cd0,0x2b3cd70);
      std::__cxx11::string::~string(local_1cd0);
      std::allocator<char>::~allocator(&local_1cd1);
      if (lVar9 == -1) {
        pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
        tcu::NotSupportedError::NotSupportedError
                  (pNVar10,"Extension not supported","GL_OES_EGL_image",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                   ,0x1b8);
        __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,
                    tcu::NotSupportedError::~NotSupportedError);
      }
      while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
             ((this->super_ImageTestCase).m_gl.eglImageTargetTexture2DOES !=
              (glEGLImageTargetTexture2DOESFunc)0x0))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          while ((dVar3 = ::deGetFalse(), dVar3 == 0 &&
                 ((this->super_ImageTestCase).m_gl.eglImageTargetRenderbufferStorageOES !=
                  (glEGLImageTargetRenderbufferStorageOESFunc)0x0))) {
            dVar3 = ::deGetFalse();
            if (dVar3 == 0) {
              tcu::TestLog::operator<<
                        ((MessageBuilder *)(attribs + 2),local_20,
                         (BeginMessageToken *)&tcu::TestLog::Message);
              pMVar7 = tcu::MessageBuilder::operator<<
                                 ((MessageBuilder *)(attribs + 2),
                                  (char (*) [59])
                                  "Creating EGLImage using GL_TEXTURE_2D with GL_RGBA storage");
              tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
              tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)(attribs + 2));
              attribs[1] = 1;
              do {
                glu::CallLogWrapper::glBindTexture
                          (&(this->super_ImageTestCase).super_CallLogWrapper,0xde1,attribs[1]);
                GVar4 = glu::CallLogWrapper::glGetError
                                  (&(this->super_ImageTestCase).super_CallLogWrapper);
                glu::checkError(GVar4,"glBindTexture(GL_TEXTURE_2D, srcTex)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                ,0x1c2);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                glu::CallLogWrapper::glTexImage2D
                          (&(this->super_ImageTestCase).super_CallLogWrapper,0xde1,0,0x1908,0x40,
                           0x40,0,0x1908,0x1401,(void *)0x0);
                GVar4 = glu::CallLogWrapper::glGetError
                                  (&(this->super_ImageTestCase).super_CallLogWrapper);
                glu::checkError(GVar4,
                                "glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL)"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                ,0x1c3);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              do {
                glu::CallLogWrapper::glTexParameteri
                          (&(this->super_ImageTestCase).super_CallLogWrapper,0xde1,0x2801,0x2601);
                GVar4 = glu::CallLogWrapper::glGetError
                                  (&(this->super_ImageTestCase).super_CallLogWrapper);
                glu::checkError(GVar4,
                                "glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                ,0x1c4);
                dVar3 = ::deGetFalse();
                pTVar2 = log;
              } while (dVar3 != 0);
              attribs[0] = 0x3038;
              image = (EGLImageKHR)0x30bc;
              pEVar1 = (this->super_ImageTestCase).super_TestCase.m_eglTestCtx;
              pvVar8 = Image::Context::getEglDisplay((Context *)local_1b18);
              pvVar12 = Image::Context::getEglContext((Context *)local_1b18);
              returnValue_00 =
                   (void *)(*(code *)pTVar2->m_log[1].writer)
                                     (pTVar2,pvVar8,pvVar12,0x30b1,attribs[1],&image);
              local_1e70 = checkCallError<void*>
                                     (pEVar1,
                                      "egl.createImageKHR(context.getEglDisplay(), context.getEglContext(), EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)srcTex, attribs)"
                                      ,returnValue_00,0x3000);
              if (local_1e70 == (void *)0x0) {
                tcu::TestLog::operator<<
                          (&local_1ff0,local_20,(BeginMessageToken *)&tcu::TestLog::Message);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   (&local_1ff0,(char (*) [30])"  Fail: Got EGL_NO_IMAGE_KHR!");
                tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder(&local_1ff0);
                qVar5 = tcu::TestContext::getTestResult
                                  ((this->super_ImageTestCase).super_TestCase.super_TestCase.
                                   super_TestNode.m_testCtx);
                if (qVar5 == QP_TEST_RESULT_PASS) {
                  tcu::TestContext::setTestResult
                            ((this->super_ImageTestCase).super_TestCase.super_TestCase.
                             super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,"Got EGL_NO_IMAGE_KHR");
                }
              }
              if (this->m_target == 0xde1) {
                tcu::TestLog::operator<<
                          ((MessageBuilder *)local_2170,local_20,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_2170,
                                    (char (*) [37])"Creating GL_TEXTURE_2D from EGLimage");
                tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_2170);
                local_2174 = 2;
                do {
                  glu::CallLogWrapper::glBindTexture
                            (&(this->super_ImageTestCase).super_CallLogWrapper,0xde1,local_2174);
                  GVar4 = glu::CallLogWrapper::glGetError
                                    (&(this->super_ImageTestCase).super_CallLogWrapper);
                  glu::checkError(GVar4,"glBindTexture(GL_TEXTURE_2D, dstTex)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                  ,0x1d7);
                  dVar3 = ::deGetFalse();
                } while (dVar3 != 0);
                do {
                  glu::CallLogWrapper::glEGLImageTargetTexture2DOES
                            (&(this->super_ImageTestCase).super_CallLogWrapper,0xde1,local_1e70);
                  GVar4 = glu::CallLogWrapper::glGetError
                                    (&(this->super_ImageTestCase).super_CallLogWrapper);
                  glu::checkError(GVar4,
                                  "glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, (GLeglImageOES)image)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                  ,0x1d8);
                  dVar3 = ::deGetFalse();
                } while (dVar3 != 0);
                do {
                  glu::CallLogWrapper::glDeleteTextures
                            (&(this->super_ImageTestCase).super_CallLogWrapper,1,&local_2174);
                  GVar4 = glu::CallLogWrapper::glGetError
                                    (&(this->super_ImageTestCase).super_CallLogWrapper);
                  glu::checkError(GVar4,"glDeleteTextures(1, &dstTex)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                  ,0x1d9);
                  dVar3 = ::deGetFalse();
                } while (dVar3 != 0);
              }
              else {
                tcu::TestLog::operator<<
                          ((MessageBuilder *)local_22f8,local_20,
                           (BeginMessageToken *)&tcu::TestLog::Message);
                pMVar7 = tcu::MessageBuilder::operator<<
                                   ((MessageBuilder *)local_22f8,
                                    (char (*) [39])"Creating GL_RENDERBUFFER from EGLimage");
                tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage)
                ;
                tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_22f8);
                local_22fc = 2;
                do {
                  glu::CallLogWrapper::glBindRenderbuffer
                            (&(this->super_ImageTestCase).super_CallLogWrapper,0x8d41,local_22fc);
                  GVar4 = glu::CallLogWrapper::glGetError
                                    (&(this->super_ImageTestCase).super_CallLogWrapper);
                  glu::checkError(GVar4,"glBindRenderbuffer(GL_RENDERBUFFER, dstRbo)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                  ,0x1e2);
                  dVar3 = ::deGetFalse();
                } while (dVar3 != 0);
                do {
                  glu::CallLogWrapper::glEGLImageTargetRenderbufferStorageOES
                            (&(this->super_ImageTestCase).super_CallLogWrapper,0x8d41,local_1e70);
                  GVar4 = glu::CallLogWrapper::glGetError
                                    (&(this->super_ImageTestCase).super_CallLogWrapper);
                  glu::checkError(GVar4,
                                  "glEGLImageTargetRenderbufferStorageOES(GL_RENDERBUFFER, (GLeglImageOES)image)"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                  ,0x1e3);
                  dVar3 = ::deGetFalse();
                } while (dVar3 != 0);
                do {
                  glu::CallLogWrapper::glDeleteRenderbuffers
                            (&(this->super_ImageTestCase).super_CallLogWrapper,1,&local_22fc);
                  GVar4 = glu::CallLogWrapper::glGetError
                                    (&(this->super_ImageTestCase).super_CallLogWrapper);
                  glu::checkError(GVar4,"glDeleteRenderbuffers(1, &dstRbo)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                  ,0x1e4);
                  dVar3 = ::deGetFalse();
                } while (dVar3 != 0);
              }
              pTVar2 = log;
              pEVar1 = (this->super_ImageTestCase).super_TestCase.m_eglTestCtx;
              pvVar8 = Image::Context::getEglDisplay((Context *)local_1b18);
              returnValue = (*(code *)pTVar2->m_log[4].lock)(pTVar2,pvVar8,local_1e70);
              checkCallReturn<unsigned_int>
                        (pEVar1,"egl.destroyImageKHR(context.getEglDisplay(), image)",returnValue,1,
                         0x3000);
              do {
                glu::CallLogWrapper::glDeleteTextures
                          (&(this->super_ImageTestCase).super_CallLogWrapper,1,
                           (GLuint *)(attribs + 1));
                GVar4 = glu::CallLogWrapper::glGetError
                                  (&(this->super_ImageTestCase).super_CallLogWrapper);
                glu::checkError(GVar4,"glDeleteTextures(1, &srcTex)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                                ,0x1eb);
                dVar3 = ::deGetFalse();
              } while (dVar3 != 0);
              Image::Context::~Context((Context *)local_1b18);
              return STOP;
            }
          }
          pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar11,(char *)0x0,"m_gl.eglImageTargetRenderbufferStorageOES",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                     ,0x1bb);
          __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
      }
      pTVar11 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar11,(char *)0x0,"m_gl.eglImageTargetTexture2DOES",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
                 ,0x1ba);
      __cxa_throw(pTVar11,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  context.m_gl.waitSync._6_1_ = 1;
  pNVar10 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"Unsupported extension: ",
             (allocator<char> *)((long)&context.m_gl.waitSync + 7));
  std::operator+(&local_78,&local_98,"EGL_KHR_gl_texture_2D_image");
  message = (char *)std::__cxx11::string::c_str();
  tcu::NotSupportedError::NotSupportedError
            (pNVar10,message,
             "eglu::hasExtension(m_eglTestCtx.getLibrary(), m_display, \"EGL_KHR_gl_texture_2D_image\")"
             ,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglImageTests.cpp"
             ,0x1a9);
  context.m_gl.waitSync._6_1_ = 0;
  __cxa_throw(pNVar10,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError);
}

Assistant:

IterateResult iterate (void)
	{
		const Library&	egl	= m_eglTestCtx.getLibrary();
		TestLog&		log	= m_testCtx.getLog();

		// \todo [2011-07-21 pyry] Try all possible EGLImage sources
		CHECK_EXTENSION(m_display, "EGL_KHR_gl_texture_2D_image");

		// Initialize result.
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

		// Create GLES2 context

		Context context(m_eglTestCtx, m_display, ContextType(ApiType::es(2, 0)), 64, 64);
		log << TestLog::Message << "Using EGL config " << eglu::getConfigID(m_eglTestCtx.getLibrary(), context.getEglDisplay(), context.getConfig()) << TestLog::EndMessage;

		// Check for OES_EGL_image
		{
			const char* glExt = (const char*)glGetString(GL_EXTENSIONS);

			if (string(glExt).find("GL_OES_EGL_image") == string::npos)
				throw tcu::NotSupportedError("Extension not supported", "GL_OES_EGL_image", __FILE__, __LINE__);

			TCU_CHECK(m_gl.eglImageTargetTexture2DOES);
			TCU_CHECK(m_gl.eglImageTargetRenderbufferStorageOES);
		}

		// Create GL_TEXTURE_2D and EGLImage from it.
		log << TestLog::Message << "Creating EGLImage using GL_TEXTURE_2D with GL_RGBA storage" << TestLog::EndMessage;

		deUint32 srcTex = 1;
		GLU_CHECK_CALL(glBindTexture(GL_TEXTURE_2D, srcTex));
		GLU_CHECK_CALL(glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA, 64, 64, 0, GL_RGBA, GL_UNSIGNED_BYTE, DE_NULL));
		GLU_CHECK_CALL(glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR));

		// Create EGL image
		EGLint		attribs[]	= { EGL_GL_TEXTURE_LEVEL_KHR, 0, EGL_NONE };
		EGLImageKHR	image		= CHECK_EXT_CALL_ERR(egl.createImageKHR(context.getEglDisplay(), context.getEglContext(), EGL_GL_TEXTURE_2D_KHR, (EGLClientBuffer)(deUintptr)srcTex, attribs), EGL_SUCCESS);
		if (image == EGL_NO_IMAGE_KHR)
		{
			log << TestLog::Message << "  Fail: Got EGL_NO_IMAGE_KHR!" << TestLog::EndMessage;

			if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got EGL_NO_IMAGE_KHR");
		}

		// Create texture or renderbuffer
		if (m_target == GL_TEXTURE_2D)
		{
			log << TestLog::Message << "Creating GL_TEXTURE_2D from EGLimage" << TestLog::EndMessage;

			deUint32 dstTex = 2;
			GLU_CHECK_CALL(glBindTexture(GL_TEXTURE_2D, dstTex));
			GLU_CHECK_CALL(glEGLImageTargetTexture2DOES(GL_TEXTURE_2D, (GLeglImageOES)image));
			GLU_CHECK_CALL(glDeleteTextures(1, &dstTex));
		}
		else
		{
			DE_ASSERT(m_target == GL_RENDERBUFFER);

			log << TestLog::Message << "Creating GL_RENDERBUFFER from EGLimage" << TestLog::EndMessage;

			deUint32 dstRbo = 2;
			GLU_CHECK_CALL(glBindRenderbuffer(GL_RENDERBUFFER, dstRbo));
			GLU_CHECK_CALL(glEGLImageTargetRenderbufferStorageOES(GL_RENDERBUFFER, (GLeglImageOES)image));
			GLU_CHECK_CALL(glDeleteRenderbuffers(1, &dstRbo));
		}

		// Destroy image
		CHECK_EXT_CALL_RET(egl.destroyImageKHR(context.getEglDisplay(), image), (EGLBoolean)EGL_TRUE, EGL_SUCCESS);

		// Destroy source texture object
		GLU_CHECK_CALL(glDeleteTextures(1, &srcTex));

		return STOP;
	}